

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_pad(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  char *pcVar13;
  undefined4 *puVar14;
  long lVar15;
  long lVar16;
  undefined8 uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined4 *puVar22;
  long lVar23;
  undefined4 uVar24;
  long local_b0;
  undefined4 *local_a8;
  long local_a0;
  undefined4 *local_90;
  long local_88;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
               ,0x1a0a,"fatal error");
  }
  if (pgVar1->nb[0] == 4) {
    if (dst->nb[0] == 4) {
      lVar2 = dst->ne[2];
      if (0 < lVar2) {
        lVar3 = pgVar1->ne[0];
        lVar4 = pgVar1->ne[1];
        lVar5 = pgVar1->ne[2];
        lVar6 = pgVar1->ne[3];
        sVar7 = pgVar1->nb[1];
        lVar8 = dst->ne[0];
        lVar9 = dst->ne[1];
        lVar10 = dst->ne[3];
        lVar15 = (long)params->nth;
        lVar18 = (long)params->ith;
        local_88 = sVar7 * lVar18;
        local_90 = (undefined4 *)((long)dst->data + lVar8 * lVar18 * 4);
        sVar11 = pgVar1->nb[2];
        sVar12 = pgVar1->nb[3];
        local_a0 = 0;
        do {
          if (lVar18 < lVar9) {
            local_a8 = local_90;
            local_b0 = local_88;
            lVar16 = lVar18;
            do {
              if (0 < lVar8) {
                lVar23 = 0;
                puVar14 = local_a8;
                lVar19 = local_b0;
                do {
                  if (0 < lVar10) {
                    lVar20 = 0;
                    lVar21 = lVar19;
                    puVar22 = puVar14;
                    do {
                      uVar24 = 0;
                      if (lVar20 < lVar6 && ((lVar23 < lVar3 && lVar16 < lVar4) && local_a0 < lVar5)
                         ) {
                        uVar24 = *(undefined4 *)((long)pgVar1->data + lVar21);
                      }
                      *puVar22 = uVar24;
                      lVar20 = lVar20 + 1;
                      lVar21 = lVar21 + sVar12;
                      puVar22 = puVar22 + lVar9 * lVar8 * lVar2;
                    } while (lVar10 != lVar20);
                  }
                  lVar23 = lVar23 + 1;
                  lVar19 = lVar19 + 4;
                  puVar14 = puVar14 + 1;
                } while (lVar23 != lVar8);
              }
              lVar16 = lVar16 + lVar15;
              local_b0 = local_b0 + sVar7 * lVar15;
              local_a8 = local_a8 + lVar8 * lVar15;
            } while (lVar16 < lVar9);
          }
          local_a0 = local_a0 + 1;
          local_88 = local_88 + sVar11;
          local_90 = local_90 + lVar9 * lVar8;
        } while (local_a0 != lVar2);
      }
      return;
    }
    pcVar13 = "dst->nb[0] == sizeof(float)";
    uVar17 = 0x19df;
  }
  else {
    pcVar13 = "src0->nb[0] == sizeof(float)";
    uVar17 = 0x19de;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
             ,uVar17,"GGML_ASSERT(%s) failed",pcVar13);
}

Assistant:

void ggml_compute_forward_pad(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_pad_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}